

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_no_run_on_unref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  long lStack_a8;
  code *pcStack_a0;
  long local_90;
  long local_88;
  undefined1 local_80 [120];
  
  pcStack_a0 = (code *)0x1d7f32;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1d7f3f;
  iVar1 = uv_timer_init(uVar2,local_80);
  local_88 = (long)iVar1;
  local_90 = 0;
  if (local_88 == 0) {
    pcStack_a0 = (code *)0x1d7f74;
    iVar1 = uv_timer_start(local_80,abort,0,0);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 != 0) goto LAB_001d8034;
    pcStack_a0 = (code *)0x1d7f9e;
    uv_unref(local_80);
    pcStack_a0 = (code *)0x1d7fa3;
    uVar2 = uv_default_loop();
    pcStack_a0 = (code *)0x1d7fad;
    iVar1 = uv_run(uVar2,0);
    local_88 = (long)iVar1;
    local_90 = 0;
    if (local_88 == 0) {
      pcStack_a0 = (code *)0x1d7fce;
      unaff_RBX = uv_default_loop();
      pcStack_a0 = (code *)0x1d7fe2;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_a0 = (code *)0x1d7fec;
      uv_run(unaff_RBX,0);
      local_88 = 0;
      pcStack_a0 = (code *)0x1d7ffa;
      uVar2 = uv_default_loop();
      pcStack_a0 = (code *)0x1d8002;
      iVar1 = uv_loop_close(uVar2);
      local_90 = (long)iVar1;
      if (local_88 == local_90) {
        pcStack_a0 = (code *)0x1d801a;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8052;
    }
  }
  else {
    pcStack_a0 = (code *)0x1d8034;
    run_test_timer_no_run_on_unref_cold_1();
LAB_001d8034:
    pcStack_a0 = (code *)0x1d8043;
    run_test_timer_no_run_on_unref_cold_2();
  }
  pcStack_a0 = (code *)0x1d8052;
  run_test_timer_no_run_on_unref_cold_3();
LAB_001d8052:
  plVar3 = &local_88;
  pcStack_a0 = once_close_cb;
  run_test_timer_no_run_on_unref_cold_4();
  pcStack_a0 = (code *)unaff_RBX;
  puts("ONCE_CLOSE_CB");
  if (plVar3 == (long *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(plVar3);
    lStack_a8 = (long)iVar1;
    if (lStack_a8 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return iVar1;
    }
  }
  plVar3 = &lStack_a8;
  once_close_cb_cold_1();
  pcVar4 = "REPEAT_CLOSE_CB";
  iVar1 = puts("REPEAT_CLOSE_CB");
  if (plVar3 != (long *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return iVar1;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(timer_no_run_on_unref) {
  uv_timer_t timer_handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, (uv_timer_cb) abort, 0, 0));
  uv_unref((uv_handle_t*) &timer_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}